

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constrained.cpp
# Opt level: O3

non_empty_string * func(non_empty_string *__return_storage_ptr__,non_empty_string *str)

{
  pointer pcVar1;
  ostream *poVar2;
  value_type *pvVar3;
  constrained_modifier<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
  modifier;
  char local_19;
  constrained_modifier<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
  local_18;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(str->value_)._M_dataplus._M_p,
                      (str->value_)._M_string_length);
  local_19 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_19,1);
  local_18.value_ = str;
  pvVar3 = type_safe::
           constrained_modifier<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
           ::get(&local_18);
  std::__cxx11::string::append((char *)pvVar3);
  type_safe::
  constrained_modifier<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
  ::~constrained_modifier(&local_18);
  (__return_storage_ptr__->value_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value_).field_2;
  pcVar1 = (str->value_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (str->value_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

non_empty_string func(non_empty_string str)
{
    std::cout << str.get_value() << '\n';
    // get_value() returns a const reference
    // if we want to modify it:
    {
        auto modifier = str.modify();
        modifier.get() += " suffix";
        // destructor of modifier verifies that str fulfills constraint again
    } // extra scope is important here
    return str;
}